

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.c
# Opt level: O1

int ndn_name_tlv_encode(ndn_encoder_t *encoder,ndn_name_t *name)

{
  bool bVar1;
  uint8_t uVar4;
  uint uVar2;
  int iVar3;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ndn_name_t *component;
  ulong uVar8;
  
  if (encoder->output_max_size == encoder->offset) {
    return -0xe;
  }
  encoder->output_value[encoder->offset] = '\a';
  encoder->offset = encoder->offset + 1;
  if ((ulong)name->components_size == 0) {
    uVar2 = 0;
  }
  else {
    lVar7 = 0;
    uVar2 = 0;
    do {
      uVar5 = *(uint *)(name->components[0].value + lVar7 + -4);
      uVar6 = (uint)name->components[0].value[lVar7 + 0x24];
      iVar3 = (uint)(0xffff < uVar5) * 2 + 3;
      if (uVar5 < 0xfd) {
        iVar3 = 1;
      }
      uVar2 = uVar2 + uVar6 + iVar3 + (uint)(0xfc < uVar6) * 2 + 1;
      lVar7 = lVar7 + 0x2c;
    } while ((ulong)name->components_size * 0x2c - lVar7 != 0);
  }
  uVar5 = encoder->offset;
  uVar6 = encoder->output_max_size - uVar5;
  if (uVar2 < 0xfd && encoder->output_max_size != uVar5) {
    iVar3 = 1;
  }
  else {
    uVar4 = (uint8_t)(uVar2 >> 8);
    if (uVar6 < 3 || 0xffff < uVar2) {
      if (uVar6 < 5) {
        iVar3 = -0xe;
        bVar1 = false;
        goto LAB_0010eb30;
      }
      encoder->output_value[uVar5] = 0xfe;
      encoder->output_value[encoder->offset + 1] = (uint8_t)(uVar2 >> 0x18);
      encoder->output_value[encoder->offset + 2] = (uint8_t)(uVar2 >> 0x10);
      encoder->output_value[encoder->offset + 3] = uVar4;
      uVar5 = encoder->offset + 4;
      iVar3 = 5;
    }
    else {
      encoder->output_value[uVar5] = 0xfd;
      encoder->output_value[encoder->offset + 1] = uVar4;
      uVar5 = encoder->offset + 2;
      iVar3 = 3;
    }
  }
  encoder->output_value[uVar5] = (uint8_t)uVar2;
  encoder->offset = encoder->offset + iVar3;
  iVar3 = 0;
  bVar1 = true;
LAB_0010eb30:
  if (bVar1) {
    if (name->components_size != '\0') {
      uVar8 = 0;
      component = name;
      do {
        iVar3 = name_component_tlv_encode(encoder,component->components);
        if (iVar3 < 0) {
          return iVar3;
        }
        uVar8 = uVar8 + 1;
        component = (ndn_name_t *)(component->components + 1);
      } while (uVar8 < name->components_size);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
ndn_name_tlv_encode(ndn_encoder_t* encoder, const ndn_name_t *name)
{
  int ret_val = -1;
  int block_sizes[name->components_size];
  ret_val = encoder_append_type(encoder, TLV_Name);
  if (ret_val != NDN_SUCCESS) return ret_val;
  size_t value_size = 0;
  for (size_t i = 0; i < name->components_size; i++) {
    block_sizes[i] = name_component_probe_block_size(&name->components[i]);
    value_size += block_sizes[i];
  }
  ret_val = encoder_append_length(encoder, value_size);
  if (ret_val != NDN_SUCCESS) return ret_val;

  for (size_t i = 0; i < name->components_size; i++) {
    int result = name_component_tlv_encode(encoder, &name->components[i]);
    if (result < 0)
      return result;
  }
  return 0;
}